

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.c
# Opt level: O1

void FillDefaultDictionary(void)

{
  long lVar1;
  long lVar2;
  char **ppcVar3;
  int *piVar4;
  bool bVar5;
  
  lVar2 = 0x80;
  piVar4 = &notes_rel;
  do {
    AddDictionaryEntry((char *)((long)&notes_rel + (long)*piVar4),lVar2);
    piVar4 = piVar4 + 1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 0xe0);
  lVar2 = 8;
  do {
    AddDictionaryEntry(*(char **)((long)&__do_global_dtors_aux_fini_array_entry + lVar2),
                       (ulong)*(uint *)((long)&octave_pitches[0].name + lVar2));
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x158);
  AddDictionaryEntry("smpsNoAttack",0xe7);
  if (target_driver < 3) {
    lVar2 = LookupDictionary("nA5");
    AddDictionaryEntry("nMaxPSG",lVar2);
    lVar2 = LookupDictionary("nA5");
    AddDictionaryEntry("nMaxPSG1",lVar2 + 0xc);
    lVar2 = LookupDictionary("nA5");
    lVar2 = lVar2 + 0xc;
  }
  else {
    lVar2 = LookupDictionary("nBb6");
    AddDictionaryEntry("nMaxPSG",lVar2 + -0xc);
    lVar2 = LookupDictionary("nBb6");
    AddDictionaryEntry("nMaxPSG1",lVar2);
    lVar2 = LookupDictionary("nB6");
  }
  AddDictionaryEntry("nMaxPSG2",lVar2);
  if (target_driver == 1) {
    lVar2 = 1;
    piVar4 = &psg_envelopes_s1_rel;
    do {
      AddDictionaryEntry((char *)((long)&psg_envelopes_s1_rel + (long)*piVar4),lVar2);
      piVar4 = piVar4 + 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 10);
  }
  else if (target_driver == 2) {
    ppcVar3 = psg_envelopes_s2;
    lVar2 = 1;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0xe);
  }
  else {
    piVar4 = &psg_envelopes_s3k_rel;
    lVar2 = 1;
    do {
      lVar1 = lVar2 + 1;
      AddDictionaryEntry((char *)((long)&psg_envelopes_s3k_rel + (long)*piVar4),lVar2);
      piVar4 = piVar4 + 1;
      lVar2 = lVar1;
    } while (lVar1 != 0x28);
    ppcVar3 = psg_envelopes_s2;
    lVar2 = 0x28;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      bVar5 = lVar2 != 0x34;
      lVar2 = lVar2 + 1;
    } while (bVar5);
  }
  switch(target_driver) {
  case 1:
    AddDictionaryEntry("dKick",0x81);
    AddDictionaryEntry("dSnare",0x82);
    AddDictionaryEntry("dTimpani",0x83);
    AddDictionaryEntry("dHiTimpani",0x88);
    AddDictionaryEntry("dMidTimpani",0x89);
    AddDictionaryEntry("dLowTimpani",0x8a);
    AddDictionaryEntry("dVLowTimpani",0x8b);
    break;
  case 2:
    ppcVar3 = dac_samples_s2;
    lVar2 = 0x81;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x92);
    break;
  case 3:
    ppcVar3 = dac_samples_s3_sk_s3d_common;
    lVar2 = 0x81;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      bVar5 = lVar2 != 0x9e;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    ppcVar3 = dac_samples_s3_sk_common;
    lVar2 = 0x9f;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      bVar5 = lVar2 != 0xc4;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    ppcVar3 = dac_samples_s3;
    lVar2 = 0xc5;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      bVar5 = lVar2 == 0xc5;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    break;
  case 4:
    ppcVar3 = dac_samples_s3_sk_s3d_common;
    lVar2 = 0x81;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      bVar5 = lVar2 != 0x9e;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    ppcVar3 = dac_samples_s3_sk_common;
    lVar2 = 0x9f;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      bVar5 = lVar2 != 0xc4;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    break;
  default:
    ppcVar3 = dac_samples_s3_sk_s3d_common;
    lVar2 = 0x81;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      bVar5 = lVar2 != 0x9e;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    ppcVar3 = dac_samples_s3_sk_common;
    lVar2 = 0x9f;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      bVar5 = lVar2 != 0xc4;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    ppcVar3 = dac_samples_s2;
    lVar2 = 0xc5;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      bVar5 = lVar2 != 0xd5;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    piVar4 = &dac_samples_s3d_rel;
    lVar2 = 0xd6;
    do {
      AddDictionaryEntry((char *)((long)&dac_samples_s3d_rel + (long)*piVar4),lVar2);
      piVar4 = piVar4 + 1;
      bVar5 = lVar2 == 0xd6;
      lVar2 = lVar2 + 1;
    } while (bVar5);
    ppcVar3 = dac_samples_s3;
    lVar2 = 0xd8;
    do {
      AddDictionaryEntry(*ppcVar3,lVar2);
      ppcVar3 = ppcVar3 + 1;
      bVar5 = lVar2 == 0xd8;
      lVar2 = lVar2 + 1;
    } while (bVar5);
  }
  AddDictionaryEntry("panNone",0);
  AddDictionaryEntry("panRight",0x40);
  AddDictionaryEntry("panLeft",0x80);
  AddDictionaryEntry("panCentre",0xc0);
  AddDictionaryEntry("panCenter",0xc0);
  AddDictionaryEntry("cPSG1",0x80);
  AddDictionaryEntry("cPSG2",0xa0);
  AddDictionaryEntry("cPSG3",0xc0);
  AddDictionaryEntry("cNoise",0xe0);
  AddDictionaryEntry("cFM3",2);
  AddDictionaryEntry("cFM4",4);
  AddDictionaryEntry("cFM5",5);
  AddDictionaryEntry("cFM6",6);
  return;
}

Assistant:

void FillDefaultDictionary(void)
{
	for (unsigned int i = 0; i < sizeof(notes) / sizeof(notes[0]); ++i)
		AddDictionaryEntry(notes[i], 0x80 + i);

	for (unsigned int i = 0; i < sizeof(octave_pitches) / sizeof(octave_pitches[0]); ++i)
		AddDictionaryEntry(octave_pitches[i].name, octave_pitches[i].value);

	AddDictionaryEntry("smpsNoAttack", smpsNoAttack);

	if (target_driver > 2)
	{
		AddDictionaryEntry("nMaxPSG", LookupDictionary("nBb6") - PSG_DELTA);
		AddDictionaryEntry("nMaxPSG1", LookupDictionary("nBb6"));
		AddDictionaryEntry("nMaxPSG2", LookupDictionary("nB6"));
	}
	else
	{
		AddDictionaryEntry("nMaxPSG", LookupDictionary("nA5"));
		AddDictionaryEntry("nMaxPSG1", LookupDictionary("nA5") + PSG_DELTA);
		AddDictionaryEntry("nMaxPSG2", LookupDictionary("nA5") + PSG_DELTA);
	}

	if (target_driver == 1)
	{
		for (unsigned int i = 0; i < sizeof(psg_envelopes_s1) / sizeof(psg_envelopes_s1[0]); ++i)
			AddDictionaryEntry(psg_envelopes_s1[i], 1 + i);
	}
	else if (target_driver == 2)
	{
		for (unsigned int i = 0; i < sizeof(psg_envelopes_s2) / sizeof(psg_envelopes_s2[0]); ++i)
			AddDictionaryEntry(psg_envelopes_s2[i], 1 + i);
	}
	else
	{
		unsigned int current_id = 1;

		for (unsigned int i = 0; i < sizeof(psg_envelopes_s3k) / sizeof(psg_envelopes_s3k[0]); ++i)
			AddDictionaryEntry(psg_envelopes_s3k[i], current_id++);

		for (unsigned int i = 0; i < sizeof(psg_envelopes_s2) / sizeof(psg_envelopes_s2[0]); ++i)
			AddDictionaryEntry(psg_envelopes_s2[i], current_id++);
	}

	if (target_driver == 1)
	{
		AddDictionaryEntry("dKick", 0x81);
		AddDictionaryEntry("dSnare", 0x82);
		AddDictionaryEntry("dTimpani", 0x83);
		AddDictionaryEntry("dHiTimpani", 0x88);
		AddDictionaryEntry("dMidTimpani", 0x89);
		AddDictionaryEntry("dLowTimpani", 0x8A);
		AddDictionaryEntry("dVLowTimpani", 0x8B);
	}
	else if (target_driver == 2)
	{
		for (unsigned int i = 0; i < sizeof(dac_samples_s2) / sizeof(dac_samples_s2[0]); ++i)
			AddDictionaryEntry(dac_samples_s2[i], 0x81 + i);
	}
	else if (target_driver == 3)
	{
		unsigned int current_id = 0x81;

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_s3d_common) / sizeof(dac_samples_s3_sk_s3d_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_s3d_common[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_common) / sizeof(dac_samples_s3_sk_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_common[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3) / sizeof(dac_samples_s3[0]); ++i)
			AddDictionaryEntry(dac_samples_s3[i], current_id++);
	}
	else if (target_driver == 4)
	{
		unsigned int current_id = 0x81;

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_s3d_common) / sizeof(dac_samples_s3_sk_s3d_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_s3d_common[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_common) / sizeof(dac_samples_s3_sk_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_common[i], current_id++);
	}
	else //if (target_driver == 5)
	{
		unsigned int current_id = 0x81;

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_s3d_common) / sizeof(dac_samples_s3_sk_s3d_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_s3d_common[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3_sk_common) / sizeof(dac_samples_s3_sk_common[0]); ++i)
			AddDictionaryEntry(dac_samples_s3_sk_common[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s2) / sizeof(dac_samples_s2[0]); ++i)
			AddDictionaryEntry(dac_samples_s2[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3d) / sizeof(dac_samples_s3d[0]); ++i)
			AddDictionaryEntry(dac_samples_s3d[i], current_id++);

		for (unsigned int i = 0; i < sizeof(dac_samples_s3) / sizeof(dac_samples_s3[0]); ++i)
			AddDictionaryEntry(dac_samples_s3[i], current_id++);
	}

	AddDictionaryEntry("panNone", 0x00);
	AddDictionaryEntry("panRight", 0x40);
	AddDictionaryEntry("panLeft", 0x80);
	AddDictionaryEntry("panCentre", 0xC0);
	AddDictionaryEntry("panCenter", 0xC0);

	AddDictionaryEntry("cPSG1", 0x80);
	AddDictionaryEntry("cPSG2", 0xA0);
	AddDictionaryEntry("cPSG3", 0xC0);
	AddDictionaryEntry("cNoise", 0xE0);
	AddDictionaryEntry("cFM3", 0x02);
	AddDictionaryEntry("cFM4", 0x04);
	AddDictionaryEntry("cFM5", 0x05);
	AddDictionaryEntry("cFM6", 0x06);
}